

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__horizontal_gather_2_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float *pfVar4;
  
  pfVar1 = output_buffer + output_sub_size * 2;
  pfVar4 = horizontal_coefficients + 4;
  do {
    pfVar2 = decode_buffer + (long)horizontal_contributors->n0 * 2;
    fVar3 = pfVar4[2];
    *(ulong *)output_buffer =
         CONCAT44(fVar3 * 0.0 + pfVar4[-1] * pfVar2[7] +
                  pfVar4[1] * pfVar2[0xb] + pfVar2[3] * pfVar4[-3] +
                  (float)((ulong)*(undefined8 *)(pfVar2 + 0xc) >> 0x20) * fVar3 +
                  pfVar4[-2] * pfVar2[5] + *pfVar4 * pfVar2[9] + pfVar2[1] * pfVar4[-4],
                  fVar3 * 0.0 + pfVar4[-1] * pfVar2[6] +
                  pfVar4[1] * pfVar2[10] + pfVar2[2] * pfVar4[-3] +
                  (float)*(undefined8 *)(pfVar2 + 0xc) * fVar3 + pfVar4[-2] * pfVar2[4] +
                  *pfVar4 * pfVar2[8] + *pfVar2 * pfVar4[-4]);
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 2;
    pfVar4 = pfVar4 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}